

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveArmArch(Parser *parser,int flags)

{
  undefined4 in_EDX;
  char *__args_1;
  pointer local_20;
  
  Architecture::setCurrent(&Arm.super_Architecture);
  switch(in_EDX) {
  case 1:
    Arm.thumb = true;
    Arm.version = AARCH_GBA;
    std::make_unique<ArchitectureCommand,char_const(&)[12],char_const(&)[7]>
              ((char (*) [12])&local_20,(char (*) [7])".gba\n.thumb");
    break;
  case 2:
    Arm.version = AARCH_NDS;
    __args_1 = ".nds\n.arm";
    goto LAB_0017e476;
  case 3:
    Arm.version = AARCH_3DS;
    __args_1 = ".3ds\n.arm";
LAB_0017e476:
    Arm.thumb = false;
    std::make_unique<ArchitectureCommand,char_const(&)[10],char_const(&)[5]>
              ((char (*) [10])&local_20,(char (*) [5])__args_1);
    break;
  case 4:
    Arm.thumb = false;
    Arm.version = AARCH_BIG;
    std::make_unique<ArchitectureCommand,char_const(&)[14],char_const(&)[5]>
              ((char (*) [14])&local_20,(char (*) [5])".arm.big\n.arm");
    break;
  case 5:
    Arm.thumb = false;
    Arm.version = AARCH_LITTLE;
    std::make_unique<ArchitectureCommand,char_const(&)[17],char_const(&)[5]>
              ((char (*) [17])&local_20,(char (*) [5])".arm.little\n.arm");
    break;
  default:
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           parser;
  }
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = local_20;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveArmArch(Parser& parser, int flags)
{
	Architecture::setCurrent(Arm);

	switch (flags)
	{
	case DIRECTIVE_ARM_GBA:
		Arm.SetThumbMode(true);
		Arm.setVersion(AARCH_GBA);
		return std::make_unique<ArchitectureCommand>(".gba\n.thumb", ".thumb");
	case DIRECTIVE_ARM_NDS:
		Arm.SetThumbMode(false);
		Arm.setVersion(AARCH_NDS);
		return std::make_unique<ArchitectureCommand>(".nds\n.arm", ".arm");
	case DIRECTIVE_ARM_3DS:
		Arm.SetThumbMode(false);
		Arm.setVersion(AARCH_3DS);
		return std::make_unique<ArchitectureCommand>(".3ds\n.arm", ".arm");
	case DIRECTIVE_ARM_BIG:
		Arm.SetThumbMode(false);
		Arm.setVersion(AARCH_BIG);
		return std::make_unique<ArchitectureCommand>(".arm.big\n.arm", ".arm");
	case DIRECTIVE_ARM_LITTLE:
		Arm.SetThumbMode(false);
		Arm.setVersion(AARCH_LITTLE);
		return std::make_unique<ArchitectureCommand>(".arm.little\n.arm", ".arm");
	}

	return nullptr;
}